

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall boost::runtime::basic_param::~basic_param(basic_param *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_basic_param = (_func_int **)&PTR__basic_param_001c9fb0;
  std::vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>::
  ~vector(&this->m_cla_ids);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1
            (&(this->p_callback).super_function1<void,_boost::unit_test::basic_cstring<const_char>_>
            );
  pcVar1 = (this->p_value_hint)._M_dataplus._M_p;
  paVar2 = &(this->p_value_hint).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->p_env_var)._M_dataplus._M_p;
  paVar2 = &(this->p_env_var).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->p_help)._M_dataplus._M_p;
  paVar2 = &(this->p_help).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->p_description)._M_dataplus._M_p;
  paVar2 = &(this->p_description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->p_name)._M_dataplus._M_p;
  paVar2 = &(this->p_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual                 ~basic_param() {}